

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_manager.c
# Opt level: O0

apx_error_t
update_computation_list_on_port
          (adt_ary_t *list,adt_hash_t *map,apx_portInstance_t *port_instance,apx_port_t *parsed_port
          )

{
  bool bVar1;
  apx_computationListId_t computation_list_id;
  apx_typeAttributes_t *self;
  apx_computation_tag *paVar2;
  adt_str_t *other;
  char *pcVar3;
  apx_computation_t *computation_1;
  apx_computationList_t *existing_item;
  apx_computationList_t *computation_list;
  adt_str_t *computation_str;
  apx_computation_t *computation;
  int32_t i;
  undefined1 local_60 [3];
  _Bool first;
  apx_error_t retval;
  adt_str_t signature;
  int32_t num_computations;
  apx_typeAttributes_t *attributes;
  apx_size_t current_length;
  apx_port_t *parsed_port_local;
  apx_portInstance_t *port_instance_local;
  adt_hash_t *map_local;
  adt_ary_t *list_local;
  
  if ((port_instance == (apx_portInstance_t *)0x0) || (parsed_port == (apx_port_t *)0x0)) {
    __assert_fail("(port_instance != NULL) && (parsed_port != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_manager.c"
                  ,0x2d4,
                  "apx_error_t update_computation_list_on_port(adt_ary_t *, adt_hash_t *, apx_portInstance_t *, const apx_port_t *)"
                 );
  }
  computation_list_id = adt_ary_length(list);
  self = apx_port_get_referenced_type_attributes(parsed_port);
  signature._20_4_ = apx_typeAttributes_num_computations(self);
  if ((self == (apx_typeAttributes_t *)0x0) || ((int)signature._20_4_ < 1)) {
    list_local._4_4_ = 0;
  }
  else {
    i = 0;
    bVar1 = true;
    adt_str_create((adt_str_t *)local_60);
    for (computation._4_4_ = 0; computation._4_4_ < (int)signature._20_4_;
        computation._4_4_ = computation._4_4_ + 1) {
      paVar2 = apx_typeAttributes_get_computation(self,computation._4_4_);
      if (paVar2 == (apx_computation_tag *)0x0) {
        __assert_fail("computation != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_manager.c"
                      ,0x2e2,
                      "apx_error_t update_computation_list_on_port(adt_ary_t *, adt_hash_t *, apx_portInstance_t *, const apx_port_t *)"
                     );
      }
      if (bVar1) {
        bVar1 = false;
      }
      else {
        adt_str_push((adt_str_t *)local_60,0x2c);
      }
      other = apx_computation_to_string(paVar2);
      if (other == (adt_str_t *)0x0) {
        i = 0x24;
        break;
      }
      adt_str_append((adt_str_t *)local_60,other);
      adt_str_delete(other);
    }
    if (i == 0) {
      pcVar3 = adt_str_cstr((adt_str_t *)local_60);
      existing_item = (apx_computationList_t *)adt_hash_value(map,pcVar3);
      if (existing_item == (apx_computationList_t *)0x0) {
        existing_item = apx_computationList_new();
        if (existing_item == (apx_computationList_t *)0x0) {
          i = 2;
        }
        else {
          for (computation._4_4_ = 0; computation._4_4_ < (int)signature._20_4_;
              computation._4_4_ = computation._4_4_ + 1) {
            paVar2 = apx_typeAttributes_get_computation(self,computation._4_4_);
            if (paVar2 == (apx_computation_tag *)0x0) {
              __assert_fail("computation != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_manager.c"
                            ,0x303,
                            "apx_error_t update_computation_list_on_port(adt_ary_t *, adt_hash_t *, apx_portInstance_t *, const apx_port_t *)"
                           );
            }
            i = apx_computationList_append_clone_of_computation(existing_item,paVar2);
            if (i != 0) break;
          }
          if (i == 0) {
            apx_computationList_set_id(existing_item,computation_list_id);
            pcVar3 = adt_str_cstr((adt_str_t *)local_60);
            adt_hash_set(map,pcVar3,existing_item);
            adt_ary_push(list,existing_item);
          }
        }
      }
      if (i == 0) {
        apx_portInstance_set_computation_list(port_instance,existing_item);
      }
    }
    adt_str_destroy((adt_str_t *)local_60);
    list_local._4_4_ = i;
  }
  return list_local._4_4_;
}

Assistant:

static apx_error_t update_computation_list_on_port(adt_ary_t* list, adt_hash_t* map,
   apx_portInstance_t* port_instance, apx_port_t const* parsed_port)
{
   assert((port_instance != NULL) && (parsed_port != NULL));
   apx_size_t current_length = (apx_size_t)adt_ary_length(list);
   apx_typeAttributes_t* attributes = apx_port_get_referenced_type_attributes(parsed_port);
   int32_t const num_computations = apx_typeAttributes_num_computations(attributes);
   if ((attributes != NULL) && (num_computations > 0))
   {
      adt_str_t signature;
      apx_error_t retval = APX_NO_ERROR;
      bool first = true;
      int32_t i;
      adt_str_create(&signature);
      for (i=0; i < num_computations; i++)
      {
         apx_computation_t const* computation = apx_typeAttributes_get_computation(attributes, i);
         assert(computation != NULL);
         if (first)
         {
            first = false;
         }
         else
         {
            adt_str_push(&signature, ',');
         }
         adt_str_t* computation_str = apx_computation_to_string(computation);
         if (computation_str != NULL)
         {
            adt_str_append(&signature, computation_str);
            adt_str_delete(computation_str);
         }
         else
         {
            retval = APX_NULL_PTR_ERROR;
            break;
         }
      }
      if (retval == APX_NO_ERROR)
      {
         apx_computationList_t* computation_list = NULL;
         apx_computationList_t* existing_item = (apx_computationList_t*)adt_hash_value(map, adt_str_cstr(&signature));
         if (existing_item == NULL)
         {
            computation_list = apx_computationList_new();
            if (computation_list != NULL)
            {
               for (i = 0; i < num_computations; i++)
               {
                  apx_computation_t const* computation = apx_typeAttributes_get_computation(attributes, i);
                  assert(computation != NULL);
                  retval = apx_computationList_append_clone_of_computation(computation_list, computation);
                  if (retval != APX_NO_ERROR)
                  {
                     break;
                  }
               }
               if (retval == APX_NO_ERROR)
               {
                  apx_computationList_set_id(computation_list, current_length);
                  adt_hash_set(map, adt_str_cstr(&signature), computation_list);
                  adt_ary_push(list, computation_list);
               }
            }
            else
            {
               retval = APX_MEM_ERROR;
            }
         }
         else
         {
            computation_list = existing_item;
         }
         if (retval == APX_NO_ERROR)
         {
            apx_portInstance_set_computation_list(port_instance, computation_list);
         }
      }
      adt_str_destroy(&signature);
      return retval;
   }
   return APX_NO_ERROR;
}